

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderAdjacencyTests::configureTestDataTriangleStrip
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data,bool withGS,bool indiced)

{
  char *local_30;
  bool indiced_local;
  bool withGS_local;
  AdjacencyTestData *test_data_local;
  GeometryShaderAdjacencyTests *this_local;
  
  if (withGS) {
    local_30 = configureTestDataTriangleStrip::gsCode;
  }
  else {
    local_30 = (char *)0x0;
  }
  test_data->m_gs_code = local_30;
  test_data->m_mode = 0xd;
  test_data->m_tf_mode = 4;
  createGrid(this,test_data);
  if (indiced) {
    setTriangleStripPointsIndiced(this,test_data);
  }
  else {
    setTriangleStripPointsNonindiced(this,test_data);
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::configureTestDataTriangleStrip(AdjacencyTestData& test_data, bool withGS,
																  bool indiced)
{
	static const char* gsCode = "${VERSION}\n"
								"\n"
								"${GEOMETRY_SHADER_REQUIRE}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"layout(triangles_adjacency)            in;\n"
								"layout(triangle_strip, max_vertices=3) out;\n"
								"\n"
								"out vec4 out_adjacent_geometry;\n"
								"out vec4 out_geometry;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    out_adjacent_geometry = gl_in[1].gl_Position;\n"
								"    out_geometry          = gl_in[0].gl_Position;\n"
								"    EmitVertex();\n"
								"    out_adjacent_geometry = gl_in[3].gl_Position;\n"
								"    out_geometry          = gl_in[2].gl_Position;\n"
								"    EmitVertex();\n"
								"    out_adjacent_geometry = gl_in[5].gl_Position;\n"
								"    out_geometry          = gl_in[4].gl_Position;\n"
								"    EmitVertex();\n"
								"    EndPrimitive();\n"
								"}\n";

	test_data.m_gs_code = (withGS) ? gsCode : 0;
	test_data.m_mode	= GL_TRIANGLE_STRIP_ADJACENCY_EXT;
	test_data.m_tf_mode = GL_TRIANGLES;

	createGrid(test_data);

	if (indiced)
	{
		setTriangleStripPointsIndiced(test_data);
	}
	else
	{
		setTriangleStripPointsNonindiced(test_data);
	}
}